

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::CommonEdgeCase::init
          (CommonEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  _Base_ptr p_Var2;
  TessPrimitiveType TVar3;
  Context *this_00;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar4;
  ShaderProgram *this_01;
  RenderTarget *renderTarget;
  long *plVar5;
  undefined8 *puVar6;
  SharedPtrStateBase *pSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  TestError *this_02;
  undefined8 uVar9;
  size_type *psVar10;
  pointer pbVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  ContextInfo *pCVar14;
  size_type *psVar15;
  Context *pCVar16;
  char *pcVar17;
  char *pcVar18;
  TestContext *pTVar19;
  _func_int **pp_Var20;
  undefined1 usePointMode;
  long lVar21;
  char *pcVar22;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  Context *local_2e8;
  long local_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [32];
  string local_2a8;
  size_type *local_288;
  value_type local_280;
  Context *local_260;
  long local_258;
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  pointer local_220;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_208;
  size_type *local_1f8;
  value_type local_1f0;
  _Base_ptr local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b8;
  string local_1a8;
  ShaderProgram *local_188;
  Context *local_180;
  long local_178;
  Context local_170;
  long local_158;
  undefined1 local_150 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined1 local_100 [24];
  pointer pbStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  if (this->m_caseType == CASETYPE_PRECISE) {
    checkGPUShader5Support((this->super_TestCase).m_context);
  }
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  local_140 = &local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,
             "${GLSL_VERSION_DECL}\n\nin highp vec2 in_v_position;\nin highp float in_v_tessParam;\n\nout highp vec2 in_tc_position;\nout highp float in_tc_tessParam;\n\nvoid main (void)\n{\n\tin_tc_position = in_v_position;\n\tin_tc_tessParam = in_v_tessParam;\n}\n"
             ,"");
  pcVar22 = "${GPU_SHADER5_REQUIRE}\n";
  pcVar18 = "";
  if (this->m_caseType == CASETYPE_PRECISE) {
    pcVar18 = "${GPU_SHADER5_REQUIRE}\n";
  }
  local_2c8._0_8_ = local_2c8 + 0x10;
  pcVar17 = pcVar18 + 0x17;
  if (this->m_caseType != CASETYPE_PRECISE) {
    pcVar17 = pcVar18;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,pcVar18,pcVar17);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_2c8,0,(char *)0x0,0x1c7dd98);
  local_2e8 = (Context *)local_2d8;
  pCVar16 = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == pCVar16) {
    local_2d8._0_8_ = pCVar16->m_testCtx;
    local_2d8._8_8_ = plVar5[3];
  }
  else {
    local_2d8._0_8_ = pCVar16->m_testCtx;
    local_2e8 = (Context *)*plVar5;
  }
  local_2e0 = plVar5[1];
  *plVar5 = (long)pCVar16;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  pCVar16 = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == pCVar16) {
    local_250._0_8_ = pCVar16->m_testCtx;
    local_250._8_8_ = plVar5[3];
    local_260 = (Context *)local_250;
  }
  else {
    local_250._0_8_ = pCVar16->m_testCtx;
    local_260 = (Context *)*plVar5;
  }
  local_258 = plVar5[1];
  *plVar5 = (long)pCVar16;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar18 = "4";
  if (this->m_primitiveType != TESSPRIMITIVETYPE_QUADS) {
    pcVar18 = (char *)0x0;
  }
  pcVar17 = "3";
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar17 = pcVar18;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,pcVar17,(allocator<char> *)&local_1a8);
  pTVar19 = (TestContext *)0xf;
  if (local_260 != (Context *)local_250) {
    pTVar19 = (TestContext *)local_250._0_8_;
  }
  if (pTVar19 < (TestContext *)(local_2a8._M_string_length + local_258)) {
    uVar9 = (TestContext *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      uVar9 = local_2a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < (TestContext *)(local_2a8._M_string_length + local_258)) goto LAB_01431603;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_260);
  }
  else {
LAB_01431603:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_2a8._M_dataplus._M_p);
  }
  local_288 = &local_280._M_string_length;
  psVar10 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar10) {
    local_280._M_string_length = *psVar10;
    local_280.field_2._M_allocated_capacity = puVar6[3];
  }
  else {
    local_280._M_string_length = *psVar10;
    local_288 = (size_type *)*puVar6;
  }
  local_280._M_dataplus._M_p = (pointer)puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    local_1f0._M_string_length = *psVar10;
    local_1f0.field_2._M_allocated_capacity = plVar5[3];
    local_1f8 = &local_1f0._M_string_length;
  }
  else {
    local_1f0._M_string_length = *psVar10;
    local_1f8 = (size_type *)*plVar5;
  }
  local_1f0._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_220 = (pointer)(local_218 + 8);
  pbVar11 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar11) {
    local_218._8_8_ = (pbVar11->_M_dataplus)._M_p;
    aStack_208._M_allocated_capacity = plVar5[3];
  }
  else {
    local_218._8_8_ = (pbVar11->_M_dataplus)._M_p;
    local_220 = (pointer)*plVar5;
  }
  local_218._0_8_ = plVar5[1];
  *plVar5 = (long)pbVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_220);
  p_Var2 = (_Base_ptr)(local_1c8 + 8);
  p_Var12 = (_Base_ptr)(plVar5 + 2);
  if ((_Base_ptr)*plVar5 == p_Var12) {
    local_1c8._8_8_ = *(undefined8 *)p_Var12;
    aStack_1b8._M_allocated_capacity = plVar5[3];
    local_1d0 = p_Var2;
  }
  else {
    local_1c8._8_8_ = *(undefined8 *)p_Var12;
    local_1d0 = (_Base_ptr)*plVar5;
  }
  local_1c8._0_8_ = plVar5[1];
  *plVar5 = (long)p_Var12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  p_Var12 = (_Base_ptr)(local_100 + 0x10);
  p_Var13 = (_Base_ptr)(plVar5 + 2);
  if ((_Base_ptr)*plVar5 == p_Var13) {
    local_100._16_8_ = *(undefined8 *)p_Var13;
    pbStack_e8 = (pointer)plVar5[3];
    local_100._0_8_ = p_Var12;
  }
  else {
    local_100._16_8_ = *(undefined8 *)p_Var13;
    local_100._0_8_ = (_Base_ptr)*plVar5;
  }
  local_100._8_8_ = plVar5[1];
  *plVar5 = (long)p_Var13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_100);
  local_180 = &local_170;
  pCVar16 = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == pCVar16) {
    local_170.m_testCtx = pCVar16->m_testCtx;
    local_170.m_renderCtx = (RenderContext *)plVar5[3];
  }
  else {
    local_170.m_testCtx = pCVar16->m_testCtx;
    local_180 = (Context *)*plVar5;
  }
  local_178 = plVar5[1];
  *plVar5 = (long)pCVar16;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((_Base_ptr)local_100._0_8_ != p_Var12) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if (local_1d0 != p_Var2) {
    operator_delete(local_1d0,local_1c8._8_8_ + 1);
  }
  if (local_220 != (pointer)(local_218 + 8)) {
    operator_delete(local_220,(ulong)(local_218._8_8_ + 1));
  }
  if (local_1f8 != &local_1f0._M_string_length) {
    operator_delete(local_1f8,local_1f0._M_string_length + 1);
  }
  psVar10 = &local_280._M_string_length;
  if (local_288 != psVar10) {
    operator_delete(local_288,local_280._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != (Context *)local_250) {
    operator_delete(local_260,(ulong)((long)(Platform **)local_250._0_8_ + 1));
  }
  if (local_2e8 != (Context *)local_2d8) {
    operator_delete(local_2e8,(ulong)((long)(Platform **)local_2d8._0_8_ + 1));
  }
  if ((ContextInfo *)local_2c8._0_8_ != (ContextInfo *)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if (this->m_caseType != CASETYPE_PRECISE) {
    pcVar22 = "";
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  pcVar18 = pcVar22 + 0x17;
  if (this->m_caseType != CASETYPE_PRECISE) {
    pcVar18 = pcVar22;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,pcVar22,pcVar18);
  usePointMode = 0x34;
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x1c7dd98);
  local_2c8._0_8_ = local_2c8 + 0x10;
  pCVar14 = (ContextInfo *)(plVar5 + 2);
  if ((ContextInfo *)*plVar5 == pCVar14) {
    local_2c8._16_8_ = pCVar14->_vptr_ContextInfo;
    local_2c8._24_8_ = plVar5[3];
  }
  else {
    local_2c8._16_8_ = pCVar14->_vptr_ContextInfo;
    local_2c8._0_8_ = (ContextInfo *)*plVar5;
  }
  local_2c8._8_8_ = plVar5[1];
  *plVar5 = (long)pCVar14;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_2c8);
  pCVar16 = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == pCVar16) {
    local_2d8._0_8_ = pCVar16->m_testCtx;
    local_2d8._8_8_ = plVar5[3];
    local_2e8 = (Context *)local_2d8;
  }
  else {
    local_2d8._0_8_ = pCVar16->m_testCtx;
    local_2e8 = (Context *)*plVar5;
  }
  local_2e0 = plVar5[1];
  *plVar5 = (long)pCVar16;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            (&local_1a8,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,this->m_spacing,
             SPACINGMODE_EQUAL,(bool)usePointMode);
  pTVar19 = (TestContext *)0xf;
  if (local_2e8 != (Context *)local_2d8) {
    pTVar19 = (TestContext *)local_2d8._0_8_;
  }
  if (pTVar19 < (TestContext *)(local_1a8._M_string_length + local_2e0)) {
    uVar9 = (TestContext *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      uVar9 = local_1a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < (TestContext *)(local_1a8._M_string_length + local_2e0)) goto LAB_01431ac8;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_01431ac8:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_1a8._M_dataplus._M_p);
  }
  psVar15 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar15) {
    local_280._M_string_length = *psVar15;
    local_280.field_2._M_allocated_capacity = puVar6[3];
    local_288 = psVar10;
  }
  else {
    local_280._M_string_length = *psVar15;
    local_288 = (size_type *)*puVar6;
  }
  local_280._M_dataplus._M_p = (pointer)puVar6[1];
  *puVar6 = psVar15;
  puVar6[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_1f8 = &local_1f0._M_string_length;
  psVar15 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar15) {
    local_1f0._M_string_length = *psVar15;
    local_1f0.field_2._M_allocated_capacity = plVar5[3];
  }
  else {
    local_1f0._M_string_length = *psVar15;
    local_1f8 = (size_type *)*plVar5;
  }
  local_1f0._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar15;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_220 = (pointer)(local_218 + 8);
  pbVar11 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar11) {
    local_218._8_8_ = (pbVar11->_M_dataplus)._M_p;
    aStack_208._M_allocated_capacity = plVar5[3];
  }
  else {
    local_218._8_8_ = (pbVar11->_M_dataplus)._M_p;
    local_220 = (pointer)*plVar5;
  }
  local_218._0_8_ = plVar5[1];
  *plVar5 = (long)pbVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_220);
  p_Var13 = (_Base_ptr)(plVar5 + 2);
  if ((_Base_ptr)*plVar5 == p_Var13) {
    local_1c8._8_8_ = *(undefined8 *)p_Var13;
    aStack_1b8._M_allocated_capacity = plVar5[3];
    local_1d0 = p_Var2;
  }
  else {
    local_1c8._8_8_ = *(undefined8 *)p_Var13;
    local_1d0 = (_Base_ptr)*plVar5;
  }
  local_1c8._0_8_ = plVar5[1];
  *plVar5 = (long)p_Var13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  TVar3 = this->m_primitiveType;
  if (TVar3 == TESSPRIMITIVETYPE_TRIANGLES) {
    local_240._0_8_ = local_240 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,
               "\thighp vec2 pos = gl_TessCoord.x*in_te_position[0] + gl_TessCoord.y*in_te_position[1] + gl_TessCoord.z*in_te_position[2];\n\n\thighp float f = sqrt(3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z))) * 0.5 + 0.5;\n\tin_f_color = vec4(gl_TessCoord*f, 1.0);\n"
               ,"");
  }
  else {
    if (TVar3 != TESSPRIMITIVETYPE_QUADS) {
      local_240._0_8_ = local_240 + 0x10;
      uVar9 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      if (local_1d0 != p_Var2) {
        operator_delete(local_1d0,local_1c8._8_8_ + 1);
      }
      if (local_220 != (pointer)(local_218 + 8)) {
        operator_delete(local_220,(ulong)(local_218._8_8_ + 1));
      }
      if (local_1f8 != &local_1f0._M_string_length) {
        operator_delete(local_1f8,local_1f0._M_string_length + 1);
      }
      if (local_288 != psVar10) {
        operator_delete(local_288,local_280._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if (local_2e8 != (Context *)local_2d8) {
        operator_delete(local_2e8,(ulong)((long)(Platform **)local_2d8._0_8_ + 1));
      }
      if ((ContextInfo *)local_2c8._0_8_ != (ContextInfo *)(local_2c8 + 0x10)) {
        operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,(ulong)((long)&(local_170.m_testCtx)->m_platform + 1));
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,(ulong)(local_130._M_dataplus._M_p + 1));
      }
      _Unwind_Resume(uVar9);
    }
    local_130.field_2._M_allocated_capacity = (size_type)&local_110;
    local_130.field_2._8_8_ = 0;
    local_110 = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_130.field_2._M_local_buf);
    local_170.m_contextInfo = (ContextInfo *)local_150;
    pCVar14 = (ContextInfo *)(plVar5 + 2);
    if ((ContextInfo *)*plVar5 == pCVar14) {
      local_150._0_8_ = pCVar14->_vptr_ContextInfo;
      local_150._8_8_ = plVar5[3];
    }
    else {
      local_150._0_8_ = pCVar14->_vptr_ContextInfo;
      local_170.m_contextInfo = (ContextInfo *)*plVar5;
    }
    local_158 = plVar5[1];
    *plVar5 = (long)pCVar14;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170.m_contextInfo);
    local_240._0_8_ = local_240 + 0x10;
    pCVar14 = (ContextInfo *)(plVar5 + 2);
    if ((ContextInfo *)*plVar5 == pCVar14) {
      local_240._16_8_ = pCVar14->_vptr_ContextInfo;
      local_240._24_8_ = plVar5[3];
    }
    else {
      local_240._16_8_ = pCVar14->_vptr_ContextInfo;
      local_240._0_8_ = (ContextInfo *)*plVar5;
    }
    local_240._8_8_ = plVar5[1];
    *plVar5 = (long)pCVar14;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  pp_Var20 = (_func_int **)0xf;
  if (local_1d0 != p_Var2) {
    pp_Var20 = (_func_int **)local_1c8._8_8_;
  }
  if (pp_Var20 < (_func_int **)(local_1c8._0_8_ + local_240._8_8_)) {
    pp_Var20 = (_func_int **)0xf;
    if ((ContextInfo *)local_240._0_8_ != (ContextInfo *)(local_240 + 0x10)) {
      pp_Var20 = (_func_int **)local_240._16_8_;
    }
    if ((_func_int **)(local_1c8._0_8_ + local_240._8_8_) <= pp_Var20) {
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_240,0,(char *)0x0,(ulong)local_1d0);
      goto LAB_01431e1b;
    }
  }
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_1d0,local_240._0_8_);
LAB_01431e1b:
  p_Var13 = (_Base_ptr)(plVar5 + 2);
  if ((_Base_ptr)*plVar5 == p_Var13) {
    local_100._16_8_ = *(undefined8 *)p_Var13;
    pbStack_e8 = (pointer)plVar5[3];
    local_100._0_8_ = p_Var12;
  }
  else {
    local_100._16_8_ = *(undefined8 *)p_Var13;
    local_100._0_8_ = (_Base_ptr)*plVar5;
  }
  local_100._8_8_ = plVar5[1];
  *plVar5 = (long)p_Var13;
  plVar5[1] = 0;
  *(undefined1 *)&p_Var13->_M_color = _S_red;
  plVar5 = (long *)std::__cxx11::string::append(local_100);
  local_260 = (Context *)local_250;
  pCVar16 = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == pCVar16) {
    local_250._0_8_ = pCVar16->m_testCtx;
    local_250._8_8_ = plVar5[3];
  }
  else {
    local_250._0_8_ = pCVar16->m_testCtx;
    local_260 = (Context *)*plVar5;
  }
  local_258 = plVar5[1];
  *plVar5 = (long)pCVar16;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((_Base_ptr)local_100._0_8_ != p_Var12) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if ((ContextInfo *)local_240._0_8_ != (ContextInfo *)(local_240 + 0x10)) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  if (TVar3 != TESSPRIMITIVETYPE_TRIANGLES) {
    if (local_170.m_contextInfo != (ContextInfo *)local_150) {
      operator_delete(local_170.m_contextInfo,local_150._0_8_ + 1);
    }
    if ((undefined1 *)local_130.field_2._M_allocated_capacity != &local_110) {
      operator_delete((void *)local_130.field_2._M_allocated_capacity,
                      CONCAT71(uStack_10f,local_110) + 1);
    }
  }
  if (local_1d0 != p_Var2) {
    operator_delete(local_1d0,local_1c8._8_8_ + 1);
  }
  if (local_220 != (pointer)(local_218 + 8)) {
    operator_delete(local_220,(ulong)(local_218._8_8_ + 1));
  }
  if (local_1f8 != &local_1f0._M_string_length) {
    operator_delete(local_1f8,local_1f0._M_string_length + 1);
  }
  if (local_288 != psVar10) {
    operator_delete(local_288,local_280._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,(ulong)(local_1a8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_2e8 != (Context *)local_2d8) {
    operator_delete(local_2e8,(ulong)((long)(Platform **)local_2d8._0_8_ + 1));
  }
  if ((ContextInfo *)local_2c8._0_8_ != (ContextInfo *)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  local_2e8 = (Context *)local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  local_188 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(local_100,0,0xac);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_2c8,(_anonymous_namespace_ *)this_00,(Context *)local_140,
             (char *)pCVar16);
  local_1d0 = (_Base_ptr)((ulong)local_1d0 & 0xffffffff00000000);
  local_1c8._0_8_ = &aStack_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,local_2c8._0_8_,(pointer)(local_2c8._0_8_ + local_2c8._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&local_110 + ((ulong)local_1d0 & 0xffffffff) * 0x18 + 0x10),
              (value_type *)local_1c8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_180,
             (char *)pCVar16);
  local_220 = (pointer)CONCAT44(local_220._4_4_,3);
  local_218._0_8_ = &aStack_208;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,local_2a8._M_dataplus._M_p,
             local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&local_110 + ((ulong)local_220 & 0xffffffff) * 0x18 + 0x10),
              (value_type *)local_218);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1a8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_260,
             (char *)pCVar16);
  local_1f8 = (size_type *)CONCAT44(local_1f8._4_4_,4);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_1a8._M_dataplus._M_p,
             local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&local_110 + ((ulong)local_1f8 & 0xffffffff) * 0x18 + 0x10),&local_1f0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_240,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_2e8
             ,(char *)pCVar16);
  local_288 = (size_type *)CONCAT44(local_288._4_4_,1);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,local_240._0_8_,(pointer)(local_240._0_8_ + local_240._8_8_));
  this_01 = local_188;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&local_110 + ((ulong)local_288 & 0xffffffff) * 0x18 + 0x10),&local_280);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_100);
  pSVar7 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar7->strongRefCount = 0;
  pSVar7->weakRefCount = 0;
  pSVar7->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02173258;
  pSVar7[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
  pSVar7->strongRefCount = 1;
  pSVar7->weakRefCount = 1;
  pSVar4 = (this->m_program).m_state;
  if (pSVar4 != pSVar7) {
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar4->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_program).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar4 = (this->m_program).m_state;
        if (pSVar4 != (SharedPtrStateBase *)0x0) {
          (*pSVar4->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_01;
    (this->m_program).m_state = pSVar7;
    LOCK();
    pSVar7->strongRefCount = pSVar7->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_program).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar1 = &pSVar7->strongRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar7->_vptr_SharedPtrStateBase[2])(pSVar7);
  }
  LOCK();
  pdVar1 = &pSVar7->weakRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar7->_vptr_SharedPtrStateBase[1])(pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((ContextInfo *)local_240._0_8_ != (ContextInfo *)(local_240 + 0x10)) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,(ulong)(local_1a8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._0_8_ != &aStack_208) {
    operator_delete((void *)local_218._0_8_,aStack_208._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != &aStack_1b8) {
    operator_delete((void *)local_1c8._0_8_,aStack_1b8._M_allocated_capacity + 1);
  }
  if ((ContextInfo *)local_2c8._0_8_ != (ContextInfo *)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar21 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&local_110 + lVar21 + 0x10));
    lVar21 = lVar21 + -0x18;
  } while (lVar21 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_2e8 != (Context *)local_2d8) {
      operator_delete(local_2e8,(ulong)((long)(Platform **)local_2d8._0_8_ + 1));
    }
    if (local_260 != (Context *)local_250) {
      operator_delete(local_260,(ulong)((long)(Platform **)local_250._0_8_ + 1));
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,(ulong)((long)&(local_170.m_testCtx)->m_platform + 1));
    }
    pbVar8 = &local_130;
    if (local_140 != pbVar8) {
      operator_delete(local_140,(ulong)(local_130._M_dataplus._M_p + 1));
      pbVar8 = extraout_RAX;
    }
    return (int)pbVar8;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x6b1);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void CommonEdgeCase::init (void)
{
	checkTessellationSupport(m_context);

	if (m_caseType == CASETYPE_PRECISE)
		checkGPUShader5Support(m_context);

	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp vec2 in_v_position;\n"
													 "in highp float in_v_tessParam;\n"
													 "\n"
													 "out highp vec2 in_tc_position;\n"
													 "out highp float in_tc_tessParam;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_position = in_v_position;\n"
													 "	in_tc_tessParam = in_v_tessParam;\n"
												 "}\n");

	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 + string(m_caseType == CASETYPE_PRECISE ? "${GPU_SHADER5_REQUIRE}\n" : "") +
													 "\n"
													 "layout (vertices = " + string(m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "3" : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? "4" : DE_NULL) + ") out;\n"
													 "\n"
													 "in highp vec2 in_tc_position[];\n"
													 "in highp float in_tc_tessParam[];\n"
													 "\n"
													 "out highp vec2 in_te_position[];\n"
													 "\n"
													 + (m_caseType == CASETYPE_PRECISE ? "precise gl_TessLevelOuter;\n\n" : "") +
													 "void main (void)\n"
													 "{\n"
													 "	in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"	gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[2]);\n"
														"	gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[0]);\n"
														"	gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[1]);\n"
													  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
														"	gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[2]);\n"
														"	gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[0]);\n"
														"	gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[3] + in_tc_tessParam[1]);\n"
														"	gl_TessLevelOuter[3] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[3]);\n"
													  : DE_NULL) +
												 "}\n");

	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 + string(m_caseType == CASETYPE_PRECISE ? "${GPU_SHADER5_REQUIRE}\n" : "") +
													 "\n"
													 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing) +
													 "\n"
													 "in highp vec2 in_te_position[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 + (m_caseType == CASETYPE_PRECISE ? "precise gl_Position;\n\n" : "") +
													 "void main (void)\n"
													 "{\n"
													 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"	highp vec2 pos = gl_TessCoord.x*in_te_position[0] + gl_TessCoord.y*in_te_position[1] + gl_TessCoord.z*in_te_position[2];\n"
														"\n"
														"	highp float f = sqrt(3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z))) * 0.5 + 0.5;\n"
														"	in_f_color = vec4(gl_TessCoord*f, 1.0);\n"
													  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
													    string()
														+ (m_caseType == CASETYPE_BASIC ?
															"	highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0]\n"
															"	               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1]\n"
															"	               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2]\n"
															"	               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
														 : m_caseType == CASETYPE_PRECISE ?
															"	highp vec2 a = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0];\n"
															"	highp vec2 b = (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1];\n"
															"	highp vec2 c = (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2];\n"
															"	highp vec2 d = (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
															"	highp vec2 pos = a+b+c+d;\n"
														 : DE_NULL) +
														"\n"
														"	highp float f = sqrt(1.0 - 2.0 * max(abs(gl_TessCoord.x - 0.5), abs(gl_TessCoord.y - 0.5)))*0.5 + 0.5;\n"
														"	in_f_color = vec4(0.1, gl_TessCoord.xy*f, 1.0);\n"
													  : DE_NULL) +
													 "\n"
													 "	// Offset the position slightly, based on the parity of the bits in the float representation.\n"
													 "	// This is done to detect possible small differences in edge vertex positions between patches.\n"
													 "	uvec2 bits = floatBitsToUint(pos);\n"
													 "	uint numBits = 0u;\n"
													 "	for (uint i = 0u; i < 32u; i++)\n"
													 "		numBits += ((bits[0] >> i) & 1u) + ((bits[1] >> i) & 1u);\n"
													 "	pos += float(numBits&1u)*0.04;\n"
													 "\n"
													 "	gl_Position = vec4(pos, 0.0, 1.0);\n"
												 "}\n");

	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}